

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcCrossProductsStates
          (BeagleCPUImpl<float,_1,_0> *this,int *tipStates,float *preOrderPartial,
          double *categoryRates,float *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  pointer pfVar1;
  double *pdVar2;
  float fVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  int iVar6;
  int iVar7;
  byte bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  ulong uVar15;
  long lVar16;
  pointer pfVar17;
  long lVar18;
  long lVar19;
  double *pdVar20;
  float *pfVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  int j;
  ulong uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined8 in_XMM7_Qb;
  vector<float,_std::allocator<float>_> tmp;
  allocator_type local_89;
  long local_88;
  float *local_80;
  value_type_conflict3 local_74;
  BeagleCPUImpl<float,_1,_0> *local_70;
  double local_68;
  double *local_60;
  float *local_58;
  int *local_50;
  vector<float,_std::allocator<float>_> local_48;
  undefined1 auVar35 [64];
  
  if (0 < this->kPatternCount) {
    lVar23 = 0;
    lVar18 = 0;
    local_80 = preOrderPartial;
    local_70 = this;
    local_68 = edgeLength;
    local_60 = categoryRates;
    local_58 = categoryWeights;
    local_50 = tipStates;
    do {
      local_74 = 0.0;
      std::vector<float,_std::allocator<float>_>::vector
                (&local_48,(ulong)(uint)(this->kStateCount * this->kStateCount),&local_74,&local_89)
      ;
      lVar16 = (long)local_50[lVar18];
      uVar5 = this->kStateCount;
      uVar15 = (ulong)uVar5;
      if (local_50[lVar18] < (int)uVar5) {
        iVar6 = this->kCategoryCount;
        if ((long)iVar6 < 1) {
          dVar36 = 0.0;
        }
        else {
          iVar7 = this->kPatternCount;
          lVar19 = (long)this->kPartialsPaddedStateCount;
          pfVar21 = (float *)(lVar23 * lVar19 + (long)local_80);
          auVar34 = ZEXT816(0) << 0x40;
          lVar22 = 0;
          do {
            fVar3 = local_58[lVar22];
            auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar3),
                                      ZEXT416((uint)local_80[lVar16 + (lVar22 * iVar7 + lVar18) *
                                                                      lVar19]));
            if (0 < (int)uVar5) {
              auVar32._0_4_ = (float)((double)(float)local_60[lVar22] * local_68);
              auVar32._4_4_ = (int)((ulong)((double)(float)local_60[lVar22] * local_68) >> 0x20);
              auVar32._8_8_ = 0;
              uVar25 = 0;
              pfVar17 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start + lVar16;
              do {
                auVar38 = vfmadd213ss_fma(ZEXT416((uint)(fVar3 * pfVar21[uVar25])),auVar32,
                                          ZEXT416((uint)*pfVar17));
                *pfVar17 = auVar38._0_4_;
                uVar25 = uVar25 + 1;
                pfVar17 = pfVar17 + (int)uVar5;
              } while (uVar15 != uVar25);
            }
            lVar22 = lVar22 + 1;
            pfVar21 = pfVar21 + iVar7 * lVar19;
          } while (lVar22 != iVar6);
          dVar36 = (double)auVar34._0_4_;
          this = local_70;
          local_88 = lVar23;
        }
        if (0 < (int)uVar5) {
          auVar37._0_8_ = this->gPatternWeights[lVar18] / dVar36;
          auVar37._8_8_ = 0;
          lVar16 = lVar16 << 2;
          lVar19 = uVar15 * 4;
          do {
            auVar33._0_8_ =
                 (double)*(float *)((long)local_48.super__Vector_base<float,_std::allocator<float>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar16);
            auVar33._8_8_ = in_XMM7_Qb;
            auVar4._8_8_ = 0;
            auVar4._0_8_ = *(ulong *)((long)outCrossProducts + lVar16 * 2);
            auVar34 = vfmadd213sd_fma(auVar33,auVar37,auVar4);
            *(long *)((long)outCrossProducts + lVar16 * 2) = auVar34._0_8_;
            lVar16 = lVar16 + lVar19;
            uVar15 = uVar15 - 1;
          } while (uVar15 != 0);
        }
      }
      else {
        iVar6 = this->kCategoryCount;
        if ((long)iVar6 < 1) {
          dVar36 = 0.0;
          auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        }
        else {
          iVar7 = this->kPatternCount;
          lVar16 = (long)this->kPartialsPaddedStateCount;
          pfVar21 = (float *)(lVar23 * lVar16 + (long)local_80);
          auVar34 = ZEXT816(0) << 0x40;
          lVar19 = 0;
          auVar28 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          do {
            auVar32 = ZEXT816(0) << 0x40;
            auVar35 = ZEXT1664(auVar32);
            if (0 < (int)uVar5) {
              uVar25 = 0;
              do {
                fVar3 = auVar35._0_4_ + pfVar21[uVar25];
                auVar35 = ZEXT464((uint)fVar3);
                auVar32 = ZEXT416((uint)fVar3);
                uVar25 = uVar25 + 1;
              } while (uVar15 != uVar25);
            }
            fVar3 = local_58[lVar19];
            if (0 < (int)uVar5) {
              auVar38._0_4_ = (float)((double)(float)local_60[lVar19] * local_68);
              auVar38._4_4_ = (int)((ulong)((double)(float)local_60[lVar19] * local_68) >> 0x20);
              auVar38._8_8_ = 0;
              uVar25 = 0;
              uVar24 = 0;
              do {
                uVar26 = 0;
                do {
                  auVar37 = vfmadd213ss_fma(ZEXT416((uint)(fVar3 * local_80[(lVar19 * iVar7 + lVar18
                                                                            ) * lVar16 + uVar24])),
                                            auVar38,ZEXT416((uint)local_48.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start
                                                  [uVar25 + uVar26]));
                  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar25 + uVar26] = auVar37._0_4_;
                  uVar26 = uVar26 + 1;
                } while (uVar15 != uVar26);
                uVar24 = uVar24 + 1;
                uVar25 = (ulong)((int)uVar25 + uVar5);
              } while (uVar24 != uVar15);
            }
            auVar34 = vfmadd231ss_fma(auVar34,auVar32,ZEXT416((uint)fVar3));
            lVar19 = lVar19 + 1;
            pfVar21 = pfVar21 + iVar7 * lVar16;
          } while (lVar19 != iVar6);
          dVar36 = (double)auVar34._0_4_;
          this = local_70;
          local_88 = lVar23;
        }
        if (0 < (int)uVar5) {
          auVar34._0_8_ = this->gPatternWeights[lVar18] / dVar36;
          auVar34._8_8_ = 0;
          auVar35 = vpbroadcastq_avx512f();
          auVar29 = vbroadcastsd_avx512f(auVar34);
          uVar25 = 0;
          pfVar17 = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar20 = outCrossProducts;
          do {
            uVar24 = 0;
            do {
              auVar30 = vpbroadcastq_avx512f();
              auVar30 = vporq_avx512f(auVar30,auVar28);
              uVar26 = vpcmpuq_avx512f(auVar30,auVar35,2);
              pfVar1 = pfVar17 + uVar24;
              bVar8 = (byte)uVar26;
              auVar27._4_4_ = (uint)((byte)(uVar26 >> 1) & 1) * (int)pfVar1[1];
              auVar27._0_4_ = (uint)(bVar8 & 1) * (int)*pfVar1;
              auVar27._8_4_ = (uint)((byte)(uVar26 >> 2) & 1) * (int)pfVar1[2];
              auVar27._12_4_ = (uint)((byte)(uVar26 >> 3) & 1) * (int)pfVar1[3];
              auVar27._16_4_ = (uint)((byte)(uVar26 >> 4) & 1) * (int)pfVar1[4];
              auVar27._20_4_ = (uint)((byte)(uVar26 >> 5) & 1) * (int)pfVar1[5];
              auVar27._24_4_ = (uint)((byte)(uVar26 >> 6) & 1) * (int)pfVar1[6];
              auVar27._28_4_ = (uint)(byte)(uVar26 >> 7) * (int)pfVar1[7];
              auVar30 = vcvtps2pd_avx512f(auVar27);
              pdVar2 = pdVar20 + uVar24;
              auVar31._8_8_ = (ulong)((byte)(uVar26 >> 1) & 1) * (long)pdVar2[1];
              auVar31._0_8_ = (ulong)(bVar8 & 1) * (long)*pdVar2;
              auVar31._16_8_ = (ulong)((byte)(uVar26 >> 2) & 1) * (long)pdVar2[2];
              auVar31._24_8_ = (ulong)((byte)(uVar26 >> 3) & 1) * (long)pdVar2[3];
              auVar31._32_8_ = (ulong)((byte)(uVar26 >> 4) & 1) * (long)pdVar2[4];
              auVar31._40_8_ = (ulong)((byte)(uVar26 >> 5) & 1) * (long)pdVar2[5];
              auVar31._48_8_ = (ulong)((byte)(uVar26 >> 6) & 1) * (long)pdVar2[6];
              auVar31._56_8_ = (uVar26 >> 7) * (long)pdVar2[7];
              auVar30 = vfmadd231pd_avx512f(auVar31,auVar29,auVar30);
              pdVar2 = pdVar20 + uVar24;
              bVar9 = (bool)((byte)(uVar26 >> 1) & 1);
              bVar10 = (bool)((byte)(uVar26 >> 2) & 1);
              bVar11 = (bool)((byte)(uVar26 >> 3) & 1);
              bVar12 = (bool)((byte)(uVar26 >> 4) & 1);
              bVar13 = (bool)((byte)(uVar26 >> 5) & 1);
              bVar14 = (bool)((byte)(uVar26 >> 6) & 1);
              *pdVar2 = (double)((ulong)(bVar8 & 1) * auVar30._0_8_ |
                                (ulong)!(bool)(bVar8 & 1) * (long)*pdVar2);
              pdVar2[1] = (double)((ulong)bVar9 * auVar30._8_8_ | (ulong)!bVar9 * (long)pdVar2[1]);
              pdVar2[2] = (double)((ulong)bVar10 * auVar30._16_8_ | (ulong)!bVar10 * (long)pdVar2[2]
                                  );
              pdVar2[3] = (double)((ulong)bVar11 * auVar30._24_8_ | (ulong)!bVar11 * (long)pdVar2[3]
                                  );
              pdVar2[4] = (double)((ulong)bVar12 * auVar30._32_8_ | (ulong)!bVar12 * (long)pdVar2[4]
                                  );
              pdVar2[5] = (double)((ulong)bVar13 * auVar30._40_8_ | (ulong)!bVar13 * (long)pdVar2[5]
                                  );
              pdVar2[6] = (double)((ulong)bVar14 * auVar30._48_8_ | (ulong)!bVar14 * (long)pdVar2[6]
                                  );
              pdVar2[7] = (double)((uVar26 >> 7) * auVar30._56_8_ |
                                  (ulong)!SUB81(uVar26 >> 7,0) * (long)pdVar2[7]);
              uVar24 = uVar24 + 8;
            } while ((uVar5 + 7 & 0xfffffff8) != uVar24);
            uVar25 = uVar25 + 1;
            pdVar20 = pdVar20 + uVar15;
            pfVar17 = pfVar17 + uVar15;
          } while (uVar25 != uVar15);
        }
      }
      if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      lVar18 = lVar18 + 1;
      lVar23 = lVar23 + 4;
    } while (lVar18 < this->kPatternCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsStates(const int *tipStates,
                                                                const REALTYPE *preOrderPartial,
                                                                const double *categoryRates,
                                                                const REALTYPE *categoryWeights,
                                                                const double edgeLength,
                                                                double *outCrossProducts,
                                                                double *outSumSquaredDerivatives) {

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        std::vector<REALTYPE> tmp(kStateCount * kStateCount, 0.0); // TODO Handle temporary memory better

        REALTYPE patternDenominator = 0.0;

        const int state = tipStates[pattern];

        if (state < kStateCount) {

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * kPartialsPaddedStateCount;

                REALTYPE denominator = preOrderPartial[v + state];
                patternDenominator += denominator * weight;

                for (int k = 0; k < kStateCount; k++) {
                    tmp[k * kStateCount + state] += preOrderPartial[v + k] * weight * scale;
                }
            }

            const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < kStateCount; k++) {
                outCrossProducts[k * kStateCount + state] += tmp[k * kStateCount + state] * patternWeight;
            }

        } else { // Missing character

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * kPartialsPaddedStateCount;

                REALTYPE denominator = 0.0;
                for (int k = 0; k < kStateCount; k++) {
                    denominator += preOrderPartial[v + k];
                }
                patternDenominator += denominator * weight;

                for (int k = 0; k < kStateCount; k++) {
                    for (int j = 0; j < kStateCount; j++) {
                        tmp[k * kStateCount + j] += preOrderPartial[v + k] * weight * scale;
                    }
                }
            }

            const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < kStateCount; k++) {
                for (int j = 0; j < kStateCount; j++) {
                    outCrossProducts[k * kStateCount + j] += tmp[k * kStateCount + j] * patternWeight;
                }
            }
        }
    }
}